

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
bssl::InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::PushBack
          (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this,
          vector<int,_std::allocator<int>_> *val)

{
  char *pcVar1;
  byte bVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  
  piVar3 = (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar5 = (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = this->size_;
  if ((ulong)bVar2 < 4) {
    pcVar1 = this->storage_ + (ulong)bVar2 * 0x18;
    *(pointer *)pcVar1 = piVar3;
    *(pointer *)(pcVar1 + 8) = piVar4;
    *(pointer *)(pcVar1 + 0x10) = piVar5;
    this->size_ = bVar2 + 1;
    return (vector<int,_std::allocator<int>_> *)pcVar1;
  }
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)piVar5 - (long)piVar3);
  }
  abort();
}

Assistant:

T &PushBack(T val) {
    T *ret = TryPushBack(std::move(val));
    BSSL_CHECK(ret != nullptr);
    return *ret;
  }